

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.hpp
# Opt level: O2

void __thiscall
crsGA::
Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
::Population(Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
             *this,uint32_t populationSize,uint32_t numGenes)

{
  pointer pCVar1;
  uint uVar2;
  ChromosomeList *__range2;
  iterator __end0;
  pointer pCVar3;
  allocator_type local_31;
  
  std::
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::vector(&this->_chromosomes,(ulong)populationSize,&local_31);
  this->_fittestChromosomeIndex = 0;
  uVar2 = std::thread::hardware_concurrency();
  ThreadPool::ThreadPool(&this->_threadPool,(ulong)uVar2);
  pCVar3 = (this->_chromosomes).
           super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->_chromosomes).
           super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->_minPerThread =
       (uint32_t)
       ((ulong)(((long)pCVar1 - (long)pCVar3) / 0x28) /
       (((long)(this->_threadPool).workers.
               super__Vector_base<crsGA::ScopedThread,_std::allocator<crsGA::ScopedThread>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)(this->_threadPool).workers.
               super__Vector_base<crsGA::ScopedThread,_std::allocator<crsGA::ScopedThread>_>._M_impl
               .super__Vector_impl_data._M_start >> 3) - 1U));
  for (; pCVar3 != pCVar1; pCVar3 = pCVar3 + 1) {
    std::vector<Gen,_std::allocator<Gen>_>::resize(&pCVar3->_genes,(ulong)numGenes);
  }
  return;
}

Assistant:

Population(uint32_t populationSize, uint32_t numGenes)
        : _chromosomes(populationSize),
          _fittestChromosomeIndex(0),
          _threadPool(),
          _minPerThread(_chromosomes.size() / (_threadPool.getNumThreads() - 1))
    {
        for (auto &c : _chromosomes)
        {
            c.setNumGenes(numGenes);
        }
    }